

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapElements
          (Reflection *this,Message *message,FieldDescriptor *field,int index1,int index2)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  undefined4 in_ECX;
  ulong uVar5;
  FieldDescriptor *in_RDX;
  Message *in_RDI;
  undefined4 in_R8D;
  char *in_stack_00000058;
  char *in_stack_00000060;
  FieldDescriptor *in_stack_00000068;
  Descriptor *in_stack_00000070;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  ExtensionSet *in_stack_000000a0;
  Message *in_stack_ffffffffffffffc8;
  Reflection *in_stack_ffffffffffffffd0;
  
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != (Descriptor *)(in_RDI->super_MessageLite)._vptr_MessageLite) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    FieldDescriptor::number(in_RDX);
    internal::ExtensionSet::SwapElements
              (in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6d290a);
    uVar5 = (ulong)(CVar3 - CPPTYPE_INT32);
    switch(uVar5) {
    case 0:
      MutableRaw<google::protobuf::RepeatedField<int>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<int>::SwapElements
                ((RepeatedField<int> *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI);
      break;
    case 1:
      MutableRaw<google::protobuf::RepeatedField<long>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<long>::SwapElements
                ((RepeatedField<long> *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI);
      break;
    case 2:
      MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<unsigned_int>::SwapElements
                ((RepeatedField<unsigned_int> *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDI >> 0x20)
                 ,(int)in_RDI);
      break;
    case 3:
      MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<unsigned_long>::SwapElements
                ((RepeatedField<unsigned_long> *)CONCAT44(in_ECX,in_R8D),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      break;
    case 4:
      MutableRaw<google::protobuf::RepeatedField<double>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<double>::SwapElements
                ((RepeatedField<double> *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI);
      break;
    case 5:
      MutableRaw<google::protobuf::RepeatedField<float>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<float>::SwapElements
                ((RepeatedField<float> *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI);
      break;
    case 6:
      MutableRaw<google::protobuf::RepeatedField<bool>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<bool>::SwapElements
                ((RepeatedField<bool> *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI);
      break;
    case 7:
      MutableRaw<google::protobuf::RepeatedField<int>>
                ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                 (FieldDescriptor *)in_stack_ffffffffffffffd0);
      RepeatedField<int>::SwapElements
                ((RepeatedField<int> *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI);
      break;
    case 8:
    case 9:
      bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x6d2a7e);
      if (bVar1) {
        MutableRaw<google::protobuf::internal::MapFieldBase>
                  ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                   (FieldDescriptor *)in_stack_ffffffffffffffd0);
        internal::MapFieldBase::MutableRepeatedField((MapFieldBase *)in_stack_ffffffffffffffd0);
        internal::RepeatedPtrFieldBase::SwapElements
                  ((RepeatedPtrFieldBase *)in_stack_ffffffffffffffd0,(int)(uVar5 >> 0x20),(int)uVar5
                  );
      }
      else {
        MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                  ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
                   (FieldDescriptor *)in_stack_ffffffffffffffd0);
        internal::RepeatedPtrFieldBase::SwapElements
                  ((RepeatedPtrFieldBase *)in_stack_ffffffffffffffd0,(int)(uVar5 >> 0x20),(int)uVar5
                  );
      }
    }
  }
  return;
}

Assistant:

void Reflection::SwapElements(Message* message, const FieldDescriptor* field,
                              int index1, int index2) const {
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                 \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:              \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field) \
        ->SwapElements(index1, index2);                   \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->SwapElements(index1, index2);
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->SwapElements(index1, index2);
        }
        break;
    }
  }
}